

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_get_region_host.cc
# Opt level: O3

string * aliyun::AliGetEndpointHost(string *__return_storage_ptr__,string *region,string *product)

{
  long lVar1;
  char *__s;
  char *pcVar2;
  long *plVar3;
  int iVar4;
  undefined1 *puVar5;
  int i;
  long lVar6;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  puVar5 = (anonymous_namespace)::regions;
  lVar6 = 0;
  do {
    lVar1 = **(long **)(puVar5 + 8);
    plVar3 = *(long **)(puVar5 + 8);
    while (lVar1 != 0) {
      iVar4 = std::__cxx11::string::compare((char *)product);
      if (iVar4 == 0) {
        __s = (char *)plVar3[1];
        pcVar2 = (char *)__return_storage_ptr__->_M_string_length;
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar2,(ulong)__s);
      }
      lVar1 = plVar3[2];
      plVar3 = plVar3 + 2;
    }
    lVar6 = lVar6 + 1;
    puVar5 = (anonymous_namespace)::regions + lVar6 * 0x10;
  } while (lVar6 != 3);
  return __return_storage_ptr__;
}

Assistant:

std::string AliGetEndpointHost(std::string region, std::string product) {
  std::string ret;
  for(int i = 0; regions[i].region_name_ ; i++) {
    for(int j = 0; regions[i].productions[j].product_name_ ; j++) {
      if(regions[i].productions[j].product_name_ == product) {
        ret = regions[i].productions[j].domain_name_;
      }
    }
  }
  return ret;
}